

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O3

void __thiscall
Assimp::OptimizeMeshesProcess::ProcessNode(OptimizeMeshesProcess *this,aiNode *pNode)

{
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *this_00;
  pointer *pppaVar1;
  uint *puVar2;
  pointer pMVar3;
  aiMesh *paVar4;
  bool bVar5;
  const_iterator end;
  ulong uVar6;
  aiMesh **ppaVar7;
  ulong uVar8;
  aiMesh **_out;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  iterator iVar12;
  uint uVar13;
  uint verts;
  aiMesh *out;
  aiMesh *local_38;
  
  if (pNode->mNumMeshes != 0) {
    this_00 = &this->merge_list;
    uVar10 = 0;
    do {
      puVar2 = pNode->mMeshes;
      pMVar3 = (this->meshes).
               super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pMVar3[puVar2[uVar10]].instance_cnt < 2) {
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(this_00,0);
        uVar9 = (ulong)pNode->mNumMeshes;
        if (uVar10 + 1 < uVar9) {
          uVar13 = 0;
          verts = 0;
          uVar6 = uVar10 & 0xffffffff;
          uVar8 = uVar10 + 1 & 0xffffffff;
          do {
            uVar11 = pNode->mMeshes[uVar8];
            if (((this->meshes).
                 super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11].instance_cnt == 1) &&
               (bVar5 = CanJoin(this,puVar2[uVar10],uVar11,verts,uVar13), bVar5)) {
              ppaVar7 = this->mScene->mMeshes + uVar11;
              iVar12._M_current =
                   (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar12._M_current ==
                  (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar12,ppaVar7);
              }
              else {
                *iVar12._M_current = *ppaVar7;
                pppaVar1 = &(this->merge_list).
                            super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                *pppaVar1 = *pppaVar1 + 1;
              }
              paVar4 = this->mScene->mMeshes[uVar11];
              verts = verts + paVar4->mNumVertices;
              uVar13 = uVar13 + paVar4->mNumFaces;
              pNode->mMeshes[uVar8] = pNode->mMeshes[pNode->mNumMeshes - 1];
              uVar11 = pNode->mNumMeshes - 1;
              uVar9 = (ulong)uVar11;
              pNode->mNumMeshes = uVar11;
              uVar8 = uVar6;
            }
            uVar11 = (int)uVar8 + 1;
            uVar6 = uVar8;
            uVar8 = (ulong)uVar11;
          } while (uVar11 < (uint)uVar9);
        }
        iVar12._M_current =
             (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        ppaVar7 = this->mScene->mMeshes + puVar2[uVar10];
        if ((this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start == iVar12._M_current) {
          iVar12._M_current =
               (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          _out = ppaVar7;
          if (iVar12._M_current ==
              (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_0016287a;
          *iVar12._M_current = *ppaVar7;
          pppaVar1 = &(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                      .super__Vector_impl_data._M_finish;
          *pppaVar1 = *pppaVar1 + 1;
        }
        else {
          _out = &local_38;
          if (iVar12._M_current ==
              (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar12,ppaVar7);
            end._M_current =
                 (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          else {
            *iVar12._M_current = *ppaVar7;
            end._M_current =
                 (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish = end._M_current;
          }
          SceneCombiner::MergeMeshes
                    (_out,0,(const_iterator)
                            (this->merge_list).
                            super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_start,end);
          iVar12._M_current =
               (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
LAB_0016287a:
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&this->output,iVar12,_out);
          }
          else {
            *iVar12._M_current = local_38;
            pppaVar1 = &(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppaVar1 = *pppaVar1 + 1;
          }
        }
        uVar13 = (int)((ulong)((long)(this->output).
                                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)(this->output).
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3) - 1;
      }
      else {
        uVar13 = pMVar3[puVar2[uVar10]].output_id;
      }
      uVar9 = uVar10 + 1;
      puVar2[uVar10] = uVar13;
      uVar10 = uVar9;
    } while (uVar9 < pNode->mNumMeshes);
  }
  if (pNode->mNumChildren != 0) {
    uVar10 = 0;
    do {
      ProcessNode(this,pNode->mChildren[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < pNode->mNumChildren);
  }
  return;
}

Assistant:

void OptimizeMeshesProcess::ProcessNode( aiNode* pNode)
{
    for (unsigned int i = 0; i < pNode->mNumMeshes;++i) {
        unsigned int& im = pNode->mMeshes[i];

        if (meshes[im].instance_cnt > 1) {
            im = meshes[im].output_id;
        }
        else  {
            merge_list.resize( 0 );
            unsigned int verts = 0, faces = 0;

            // Find meshes to merge with us
            for (unsigned int a = i+1; a < pNode->mNumMeshes;++a) {
                unsigned int am = pNode->mMeshes[a];
                if (meshes[am].instance_cnt == 1 && CanJoin(im,am,verts,faces)) {

                    merge_list.push_back(mScene->mMeshes[am]);
                    verts += mScene->mMeshes[am]->mNumVertices;
                    faces += mScene->mMeshes[am]->mNumFaces;

                    pNode->mMeshes[a] = pNode->mMeshes[pNode->mNumMeshes - 1];
                    --pNode->mNumMeshes;
                    --a;
                }
            }

            // and merge all meshes which we found, replace the old ones
            if (!merge_list.empty()) {
                merge_list.push_back(mScene->mMeshes[im]);

                aiMesh* out;
                SceneCombiner::MergeMeshes(&out,0,merge_list.begin(),merge_list.end());
                output.push_back(out);
            } else {
                output.push_back(mScene->mMeshes[im]);
            }
            im = static_cast<unsigned int>(output.size()-1);
        }
    }


    for( unsigned int i = 0; i < pNode->mNumChildren; ++i ) {
        ProcessNode( pNode->mChildren[ i ] );
    }
}